

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::BufferMemoryBarrier
          (DeviceContextVkImpl *this,IBuffer *pBuffer,VkAccessFlags NewAccessFlags)

{
  RESOURCE_STATE NewState;
  BufferVkImpl *BufferVk;
  char (*in_RCX) [19];
  char (*in_R8) [38];
  string msg;
  
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5cce7f,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BufferMemoryBarrier",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xc2f);
    std::__cxx11::string::~string((string *)&msg);
  }
  BufferVk = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  if ((BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_State == RESOURCE_STATE_UNKNOWN)
  {
    FormatString<char[53],char_const*,char[38]>
              (&msg,(Diligent *)"Failed to execute buffer memory barrier for buffer \'",
               (char (*) [53])
               &(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                .m_Desc,(char **)"\' because the buffer state is unknown",in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    NewState = VkAccessFlagsToResourceStates(NewAccessFlags);
    if ((NewState & ~(BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>).m_State) !=
        RESOURCE_STATE_UNKNOWN) {
      TransitionBufferState(this,BufferVk,RESOURCE_STATE_UNKNOWN,NewState,true);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BufferMemoryBarrier(IBuffer* pBuffer, VkAccessFlags NewAccessFlags)
{
    VERIFY_EXPR(pBuffer != nullptr);
    BufferVkImpl* pBuffVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    if (!pBuffVk->IsInKnownState())
    {
        LOG_ERROR_MESSAGE("Failed to execute buffer memory barrier for buffer '", pBuffVk->GetDesc().Name, "' because the buffer state is unknown");
        return;
    }
    RESOURCE_STATE NewState = VkAccessFlagsToResourceStates(NewAccessFlags);
    if ((pBuffVk->GetState() & NewState) != NewState)
    {
        TransitionBufferState(*pBuffVk, RESOURCE_STATE_UNKNOWN, NewState, true);
    }
}